

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O0

void __thiscall CLIListener::on_input(CLIListener *this,Poll *p)

{
  undefined8 p_00;
  bool bVar1;
  ssize_t sVar2;
  ostream *poVar3;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  int local_ac;
  undefined1 local_a8 [4];
  int i;
  string arg;
  is_any_ofF<char> local_80;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  char local_39;
  int read_sz;
  char ch;
  string line;
  Poll *p_local;
  CLIListener *this_local;
  
  line.field_2._8_8_ = p;
  std::__cxx11::string::string((string *)&read_sz);
  while( true ) {
    sVar2 = read((this->super_Subscriber).fd,&local_39,1);
    if ((int)sVar2 != 1 || local_39 == '\n') break;
    std::__cxx11::string::operator+=((string *)&read_sz,local_39);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Read command ");
  poVar3 = std::operator<<(poVar3,(string *)&read_sz);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_68);
  boost::algorithm::is_any_of<char[2]>(&local_80,(char (*) [2])0x1c5ac3);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&read_sz,&local_80
             ,token_compress_off);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_80);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
  if (bVar1) {
    print_illegal();
    arg.field_2._12_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)local_a8);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68);
    if (1 < sVar4) {
      for (local_ac = 1; uVar5 = (ulong)local_ac,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_68), uVar5 < sVar4 - 1; local_ac = local_ac + 1) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_68,(long)local_ac);
        std::operator+(&local_d0,pvVar6,' ');
        std::__cxx11::string::operator+=((string *)local_a8,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68,sVar4 - 1);
      std::__cxx11::string::operator+=((string *)local_a8,(string *)pvVar6);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_68,0);
    __first._M_current = (char *)std::__cxx11::string::begin();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_68,0);
    __last._M_current = (char *)std::__cxx11::string::end();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_68,0);
    __result._M_current = (char *)std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (__first,__last,__result,tolower);
    p_00 = line.field_2._8_8_;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_68,0);
    exec_command(this,(Poll *)p_00,pvVar6,(string *)local_a8);
    if (((this->super_Subscriber).expected & 1U) != 0) {
      print_prompt();
    }
    if ((int)sVar2 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Reached EOF, terminating");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Poll::do_shutdown((Poll *)line.field_2._8_8_);
    }
    std::__cxx11::string::~string((string *)local_a8);
    arg.field_2._12_4_ = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  std::__cxx11::string::~string((string *)&read_sz);
  return;
}

Assistant:

void CLIListener::on_input(Poll &p) {
  std::string line;
  char ch;
  int read_sz;
  while ((read_sz = read(fd, &ch, 1)) == 1 && ch != '\n') {
    line += ch;
  }
  std::cout << "Read command " << line << std::endl;
  std::vector<std::string> tokens;
  boost::split(tokens, line, boost::is_any_of(" "));
  if (tokens.empty()) {
    print_illegal();
    return;
  }
  std::string arg;
  if (tokens.size() > 1) {
    for (int i = 1; i < tokens.size() - 1; ++i)
      arg += tokens[i] + ' ';
    arg += tokens[tokens.size() - 1];
  }
  std::transform(tokens[0].begin(), tokens[0].end(), tokens[0].begin(), ::tolower);
  exec_command(p, tokens[0], arg);
  if (this->expected & POLLIN) {
    print_prompt();
  }
  if (read_sz == 0) {//EOF reached
    std::cout << "Reached EOF, terminating" << std::endl;
    p.do_shutdown();
  }
}